

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int cpu_breakpoint_remove_m68k(CPUState *cpu,vaddr pc,int flags)

{
  QTailQLink *pQVar1;
  anon_union_16_2_aaf24f3d_for_entry *paVar2;
  CPUBreakpoint *mem;
  
  mem = (cpu->breakpoints).tqh_first;
  while( true ) {
    if (mem == (CPUBreakpoint *)0x0) {
      return -2;
    }
    if ((mem->pc == pc) && (mem->flags == flags)) break;
    mem = (mem->entry).tqe_next;
  }
  pQVar1 = (mem->entry).tqe_circ.tql_prev;
  paVar2 = &((mem->entry).tqe_next)->entry;
  if ((mem->entry).tqe_next == (CPUBreakpoint *)0x0) {
    paVar2 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->breakpoints;
  }
  (paVar2->tqe_circ).tql_prev = pQVar1;
  pQVar1->tql_next = (mem->entry).tqe_next;
  (mem->entry).tqe_next = (CPUBreakpoint *)0x0;
  (mem->entry).tqe_circ.tql_prev = (QTailQLink *)0x0;
  tb_flush_m68k(cpu);
  g_free(mem);
  return 0;
}

Assistant:

int cpu_breakpoint_remove(CPUState *cpu, vaddr pc, int flags)
{
    CPUBreakpoint *bp;

    QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
        if (bp->pc == pc && bp->flags == flags) {
            cpu_breakpoint_remove_by_ref(cpu, bp);
            return 0;
        }
    }
    return -ENOENT;
}